

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall BackwardPass::IsEmptyLoopAfterMemOp(BackwardPass *this,Loop *loop)

{
  OpCode OVar1;
  Type pSVar2;
  Type pBVar3;
  BasicBlock *pBVar4;
  Instr *pIVar5;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  BOOLEAN BVar9;
  uint uVar10;
  undefined4 *puVar11;
  Type *ppBVar12;
  StackSym *pSVar13;
  long lVar14;
  Instr *this_01;
  Func **ppFVar15;
  Opnd *pOVar16;
  Instr *pIVar17;
  undefined1 local_58 [8];
  anon_class_16_2_3f78c113 IsInductionVariableUse;
  Iterator __iter;
  Loop *loop_local;
  
  __iter.current = (NodeBase *)loop;
  bVar7 = GlobOpt::HasMemOp(this->globOpt,loop);
  if (bVar7) {
    local_58 = (undefined1  [8])&__iter.current;
    pSVar2 = (loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    IsInductionVariableUse.loop = (Loop **)this;
    if (((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar2 == &loop->blockList) ||
       ((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar2->next->next !=
        &loop->blockList)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x239e,"(loop->blockList.HasTwo())","loop->blockList.HasTwo()");
      if (!bVar7) {
LAB_003ea95a:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar11 = 0;
      loop = (Loop *)__iter.current;
    }
    else {
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    IsInductionVariableUse.this = (BackwardPass *)&loop->blockList;
    __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                  IsInductionVariableUse.this;
    while( true ) {
      if (__iter.list == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) goto LAB_003ea95a;
        *puVar11 = 0;
      }
      __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      bVar7 = (BackwardPass *)__iter.list == IsInductionVariableUse.this;
      if (bVar7) break;
      ppBVar12 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&IsInductionVariableUse.this);
      pBVar3 = *ppBVar12;
      if ((pBVar3->field_0x18 & 1) == 0) {
        pBVar4 = pBVar3->next;
        ppFVar15 = (Func **)&pBVar4->firstInstr;
        if (pBVar4 == (BasicBlock *)0x0) {
          ppFVar15 = &pBVar3->func;
        }
        lVar14 = 0x18;
        if (pBVar4 == (BasicBlock *)0x0) {
          lVar14 = 0xd0;
        }
        lVar14 = *(long *)((long)&(*ppFVar15)->m_alloc + lVar14);
        if (lVar14 == 0) {
          pIVar17 = (Instr *)0x0;
        }
        else {
          pIVar17 = *(Instr **)(lVar14 + 0x10);
        }
        pIVar5 = pBVar3->firstInstr;
LAB_003ea7c5:
        this_01 = pIVar5;
        if (this_01 != pIVar17) {
          pIVar5 = this_01->m_next;
          if (((this_01->m_kind != InstrKindLabel) && (this_01->m_kind != InstrKindProfiledLabel))
             && (bVar8 = IR::Instr::IsRealInstr(this_01), bVar8)) {
            OVar1 = this_01->m_opcode;
            uVar10 = (uint)OVar1;
            if ((OVar1 & ~ExtendedOpcodePrefix) != IncrLoopBodyCount) {
              if (this_01->m_kind == InstrKindBranch) {
                if (OVar1 < ADD) {
                  if ((OVar1 == Br) || (OVar1 == MultiBr)) goto LAB_003ea7c5;
                }
                else {
                  bVar8 = LowererMD::IsUnconditionalBranch(this_01);
                  if (bVar8) goto LAB_003ea7c5;
                  uVar10 = (uint)this_01->m_opcode;
                }
              }
              if ((0x24 < uVar10 - 0x1c0) ||
                 ((0x1000000003U >> ((ulong)(uVar10 - 0x1c0) & 0x3f) & 1) == 0)) {
                if (uVar10 - 0x26 < 2) {
                  pOVar16 = this_01->m_src1;
                }
                else {
                  if (uVar10 == 6) goto LAB_003ea7c5;
                  if (this_01->m_kind != InstrKindBranch) {
                    return bVar7;
                  }
                  bVar8 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                                    ((anon_class_16_2_3f78c113 *)local_58,this_01->m_src1);
                  if (bVar8) goto LAB_003ea7c5;
                  pOVar16 = this_01->m_src2;
                }
                bVar8 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                                  ((anon_class_16_2_3f78c113 *)local_58,pOVar16);
                if (!bVar8) {
                  return bVar7;
                }
                goto LAB_003ea7c5;
              }
              bVar8 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                                ((anon_class_16_2_3f78c113 *)local_58,this_01->m_dst);
              if (!bVar8) {
                pOVar16 = this_01->m_dst;
                if (pOVar16 == (Opnd *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar11 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                     ,0x23b6,"(instr->GetDst())","instr->GetDst()");
                  if (!bVar8) goto LAB_003ea95a;
                  *puVar11 = 0;
                  pOVar16 = this_01->m_dst;
                }
                pSVar13 = IR::Opnd::GetStackSym(pOVar16);
                if (pSVar13 != (StackSym *)0x0) {
                  this_00 = (BVSparse<Memory::JitArenaAllocator> *)__iter.current[0x30].next[1].next
                  ;
                  pSVar13 = IR::Opnd::GetStackSym(this_01->m_dst);
                  BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (this_00,(pSVar13->super_Sym).m_id);
                  if (BVar9 != '\0') {
                    return bVar7;
                  }
                }
              }
            }
          }
          goto LAB_003ea7c5;
        }
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool
BackwardPass::IsEmptyLoopAfterMemOp(Loop *loop)
{
    if (globOpt->HasMemOp(loop))
    {
        const auto IsInductionVariableUse = [&](IR::Opnd *opnd) -> bool
        {
            Loop::InductionVariableChangeInfo  inductionVariableChangeInfo = { 0, 0 };
            return (opnd &&
                opnd->GetStackSym() &&
                loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(this->globOpt->GetVarSymID(opnd->GetStackSym())) &&
                (((Loop::InductionVariableChangeInfo)
                    loop->memOpInfo->inductionVariableChangeInfoMap->
                    LookupWithKey(this->globOpt->GetVarSymID(opnd->GetStackSym()), inductionVariableChangeInfo)).unroll != Js::Constants::InvalidLoopUnrollFactor));
        };

        Assert(loop->blockList.HasTwo());

        FOREACH_BLOCK_IN_LOOP(bblock, loop)
        {

            FOREACH_INSTR_IN_BLOCK_EDITING(instr, instrPrev, bblock)
            {
                if (instr->IsLabelInstr() || !instr->IsRealInstr() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || instr->m_opcode == Js::OpCode::StLoopBodyCount
                    || (instr->IsBranchInstr() && instr->AsBranchInstr()->IsUnconditional()))
                {
                    continue;
                }
                else
                {
                    switch (instr->m_opcode)
                    {
                    case Js::OpCode::Nop:
                        break;
                    case Js::OpCode::Ld_I4:
                    case Js::OpCode::Add_I4:
                    case Js::OpCode::Sub_I4:

                        if (!IsInductionVariableUse(instr->GetDst()))
                        {
                            Assert(instr->GetDst());
                            if (instr->GetDst()->GetStackSym()
                                && loop->memOpInfo->inductionVariablesUsedAfterLoop->Test(instr->GetDst()->GetStackSym()->m_id))
                            {
                                // We have use after the loop for a variable defined inside the loop. So the loop can't be removed.
                                return false;
                            }
                        }
                        break;
                    case Js::OpCode::Decr_A:
                    case Js::OpCode::Incr_A:
                        if (!IsInductionVariableUse(instr->GetSrc1()))
                        {
                            return false;
                        }
                        break;
                    default:
                        if (instr->IsBranchInstr())
                        {
                            if (IsInductionVariableUse(instr->GetSrc1()) || IsInductionVariableUse(instr->GetSrc2()))
                            {
                                break;
                            }
                        }
                        return false;
                    }
                }

            }
            NEXT_INSTR_IN_BLOCK_EDITING;

        }NEXT_BLOCK_IN_LIST;

        return true;
    }

    return false;
}